

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluCheckDecIn(word t,int nVars)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (1 < nVars) {
    uVar4 = (long)(((ulong)((uint)t & 0x55555555) << 0x20) * 3) >> 0x20;
    uVar5 = (ulong)(int)((uint)((t & 0xaaaaaaaaaaaaaaaa) >> 1) | (uint)(t & 0xaaaaaaaaaaaaaaaa));
    uVar2 = 1;
    do {
      if (uVar2 == 6) {
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x337,"word Abc_Tt6Cofactor0(word, int)");
      }
      uVar8 = s_Truths6Neg[uVar2] & uVar4;
      bVar1 = (byte)(1 << ((byte)uVar2 & 0x1f));
      uVar7 = (uint)uVar8 | (uint)(uVar8 << (bVar1 & 0x3f));
      uVar8 = Truth6[uVar2] & uVar4;
      uVar6 = (uint)uVar8 | (uint)(uVar8 >> (bVar1 & 0x3f));
      uVar8 = s_Truths6Neg[uVar2] & uVar5;
      uVar3 = (uint)uVar8 | (uint)(uVar8 << (bVar1 & 0x3f));
      uVar8 = Truth6[uVar2] & uVar5;
      if ((uVar7 == uVar6) && (uVar7 == uVar3)) {
        return 1;
      }
      uVar9 = (uint)uVar8 | (uint)(uVar8 >> (bVar1 & 0x3f));
      if ((uVar7 == uVar3 || uVar7 == uVar6) && (uVar7 == uVar9)) {
        return 1;
      }
      if ((uVar6 == uVar3) && (uVar6 == uVar9)) {
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)nVars != uVar2);
  }
  return 0;
}

Assistant:

int If_CluCheckDecIn( word t, int nVars )
{
    int v, u, Cof2[2], Cof4[4];
//    for ( v = 0; v < nVars; v++ )
    for ( v = 0; v < 1; v++ ) // restrict to the first (decomposed) input
    {
        Cof2[0] = Abc_Tt6Cofactor0( t, v );
        Cof2[1] = Abc_Tt6Cofactor1( t, v );
        for ( u = v+1; u < nVars; u++ )
        {
            Cof4[0] = Abc_Tt6Cofactor0( Cof2[0], u );
            Cof4[1] = Abc_Tt6Cofactor1( Cof2[0], u );
            Cof4[2] = Abc_Tt6Cofactor0( Cof2[1], u );
            Cof4[3] = Abc_Tt6Cofactor1( Cof2[1], u );
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[2] )
                return 1;
            if ( Cof4[0] == Cof4[2] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[1] == Cof4[2] && Cof4[1] == Cof4[3] )
                return 1;
        }
    }
    return 0;
}